

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvex2dConvex2dAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtConvex2dConvex2dAlgorithm::cbtConvex2dConvex2dAlgorithm
          (cbtConvex2dConvex2dAlgorithm *this,cbtPersistentManifold *mf,
          cbtCollisionAlgorithmConstructionInfo *ci,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtVoronoiSimplexSolver *simplexSolver,
          cbtConvexPenetrationDepthSolver *pdSolver,int param_7,int param_8)

{
  cbtActivatingCollisionAlgorithm::cbtActivatingCollisionAlgorithm
            (&this->super_cbtActivatingCollisionAlgorithm,ci,body0Wrap,body1Wrap);
  (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
  _vptr_cbtCollisionAlgorithm = (_func_int **)&PTR__cbtConvex2dConvex2dAlgorithm_01194e80;
  this->m_simplexSolver = simplexSolver;
  this->m_pdSolver = pdSolver;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  this->m_lowLevelOfDetail = false;
  return;
}

Assistant:

cbtConvex2dConvex2dAlgorithm::cbtConvex2dConvex2dAlgorithm(cbtPersistentManifold* mf, const cbtCollisionAlgorithmConstructionInfo& ci, const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, cbtSimplexSolverInterface* simplexSolver, cbtConvexPenetrationDepthSolver* pdSolver, int /* numPerturbationIterations */, int /* minimumPointsPerturbationThreshold */)
	: cbtActivatingCollisionAlgorithm(ci, body0Wrap, body1Wrap),
	  m_simplexSolver(simplexSolver),
	  m_pdSolver(pdSolver),
	  m_ownManifold(false),
	  m_manifoldPtr(mf),
	  m_lowLevelOfDetail(false)
{
	(void)body0Wrap;
	(void)body1Wrap;
}